

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode * __thiscall JSONNode::at_nocase(JSONNode *this,json_string *name_t)

{
  internalJSONNode *piVar1;
  uchar uVar2;
  json_string *__lhs;
  JSONNode **ppJVar3;
  out_of_range *this_00;
  string *psVar4;
  allocator local_61;
  json_string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  piVar1 = this->internal;
  std::__cxx11::string::string((string *)&local_60,"no internal",(allocator *)&local_40);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  uVar2 = type(this);
  __lhs = jsonSingletonERROR_NON_ITERATABLE::getValue_abi_cxx11_();
  std::operator+(&local_60,__lhs,"at_nocase");
  JSONDebug::_JSON_ASSERT(uVar2 == '\x05',&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  ppJVar3 = internalJSONNode::at_nocase(this->internal,name_t);
  if (ppJVar3 != (JSONNode **)0x0) {
    return *ppJVar3;
  }
  std::__cxx11::string::string
            ((string *)&local_40,"at_nocase const could not find child by name: ",&local_61);
  std::operator+(&local_60,&local_40,name_t);
  JSONDebug::_JSON_FAIL(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar4 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar4);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("at_nocase"));
	   if (JSONNode ** res = internal -> at_nocase(name_t)){
		  return *(*res);
	   }
	   JSON_FAIL(json_string(JSON_TEXT("at_nocase const could not find child by name: ")) + name_t);
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }